

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

int Abc_NtkDelayTraceCritPath_rec
              (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Abc_Obj_t *pLeaf,Vec_Int_t *vBest)

{
  float *pfVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pNode_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int Fill;
  ulong uVar8;
  long lVar9;
  Abc_Obj_t *pFanin;
  float local_3c;
  
  uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar5 != 2) {
    if (uVar5 == 7) {
      pAVar2 = pNode->pNtk;
      iVar6 = pNode->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,(int)pLeaf);
      if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
LAB_0030e17f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pAVar3 = pNode->pNtk;
      iVar7 = pAVar3->nTravIds;
      if ((pAVar2->vTravIds).pArray[iVar6] == iVar7) {
        iVar6 = pNode->Id;
        if ((-1 < (long)iVar6) && (iVar6 < vBest->nSize)) {
          bVar4 = -1 < vBest->pArray[iVar6];
          goto LAB_0030df9c;
        }
        goto LAB_0030e17f;
      }
      iVar6 = pNode->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
      if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
LAB_0030e19e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar6] = iVar7;
      if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                      ,0x34f,
                      "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                     );
      }
      if ((pNode->vFanins).nSize < 1) {
        pFanin = (Abc_Obj_t *)0x0;
      }
      else {
        local_3c = 1e+09;
        lVar9 = 0;
        pFanin = (Abc_Obj_t *)0x0;
        do {
          pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar9]];
          iVar6 = Abc_NtkDelayTraceCritPath_rec(vSlacks,pNode_00,pLeaf,vBest);
          if (iVar6 != 0) {
            if (pFanin != (Abc_Obj_t *)0x0) {
              iVar6 = pNode->Id;
              if (((long)iVar6 < 0) || (vSlacks->nSize <= iVar6)) goto LAB_0030e17f;
              uVar8 = (ulong)(uint)vSlacks->pArray[iVar6] + lVar9;
              iVar6 = (int)uVar8;
              if ((iVar6 < 0) || (vSlacks->nSize <= iVar6)) goto LAB_0030e17f;
              pfVar1 = (float *)(vSlacks->pArray + (uVar8 & 0xffffffff));
              if (local_3c < *pfVar1 || local_3c == *pfVar1) goto LAB_0030e132;
            }
            iVar6 = pNode->Id;
            if (((long)iVar6 < 0) || (vSlacks->nSize <= iVar6)) goto LAB_0030e17f;
            uVar8 = (ulong)(uint)vSlacks->pArray[iVar6] + lVar9;
            iVar6 = (int)uVar8;
            if ((iVar6 < 0) || (vSlacks->nSize <= iVar6)) goto LAB_0030e17f;
            local_3c = (float)vSlacks->pArray[uVar8 & 0xffffffff];
            pFanin = pNode_00;
          }
LAB_0030e132:
          lVar9 = lVar9 + 1;
        } while (lVar9 < (pNode->vFanins).nSize);
      }
      bVar4 = pFanin != (Abc_Obj_t *)0x0;
      if (bVar4) {
        iVar6 = pNode->Id;
        iVar7 = Abc_NodeFindFanin(pNode,pFanin);
        if (((long)iVar6 < 0) || (vBest->nSize <= iVar6)) goto LAB_0030e19e;
        vBest->pArray[iVar6] = iVar7;
        bVar4 = true;
      }
      goto LAB_0030df9c;
    }
    if (uVar5 != 5) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                    ,0x349,
                    "int Abc_NtkDelayTraceCritPath_rec(Vec_Int_t *, Abc_Obj_t *, Abc_Obj_t *, Vec_Int_t *)"
                   );
    }
  }
  bVar4 = pLeaf == pNode || pLeaf == (Abc_Obj_t *)0x0;
LAB_0030df9c:
  return (int)bVar4;
}

Assistant:

int Abc_NtkDelayTraceCritPath_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Abc_Obj_t * pLeaf, Vec_Int_t * vBest )
{
    Abc_Obj_t * pFanin, * pFaninBest = NULL;
    float SlackMin = ABC_INFINITY;  int i;
    // check primary inputs
    if ( Abc_ObjIsCi(pNode) )
        return (pLeaf == NULL || pLeaf == pNode);
    assert( Abc_ObjIsNode(pNode) );
    // check visited
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return Vec_IntEntry(vBest, Abc_ObjId(pNode)) >= 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the node
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, pFanin, pLeaf, vBest ) )
            continue;
        if ( pFaninBest == NULL || SlackMin > Abc_NtkDelayTraceSlack(vSlacks, pNode, i) )
        {
            pFaninBest = pFanin;
            SlackMin = Abc_NtkDelayTraceSlack(vSlacks, pNode, i);
        }
    }
    if ( pFaninBest != NULL )
        Vec_IntWriteEntry( vBest, Abc_ObjId(pNode), Abc_NodeFindFanin(pNode, pFaninBest) );
    return (pFaninBest != NULL);
}